

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidget::QTreeWidget(QTreeWidget *this,QWidget *parent)

{
  long lVar1;
  QTreeViewPrivate *dd;
  array<QMetaObject::Connection,_12UL> *this_00;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetPrivate *d;
  undefined1 clickable;
  QTreeWidgetPrivate *in_stack_fffffffffffffda0;
  QAbstractItemView *pQVar2;
  QHeaderView *this_01;
  QTreeView *in_stack_fffffffffffffdb0;
  QTreeWidget *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  int columns;
  code *signal;
  QTreeModel *in_stack_fffffffffffffdd0;
  ConnectionType type;
  uint in_stack_fffffffffffffdf8;
  undefined4 uVar3;
  Object *in_stack_fffffffffffffe00;
  Function in_stack_fffffffffffffe20;
  code *slot;
  offset_in_QAbstractItemModel_to_subr in_stack_fffffffffffffe30;
  QAbstractItemModel *in_stack_fffffffffffffe60;
  QTreeView *in_stack_fffffffffffffe68;
  
  columns = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dd = (QTreeViewPrivate *)operator_new(0x6f0);
  QTreeWidgetPrivate::QTreeWidgetPrivate(in_stack_fffffffffffffda0);
  QTreeView::QTreeView(in_stack_fffffffffffffdb0,dd,(QWidget *)in_stack_fffffffffffffda0);
  *in_RDI = &PTR_metaObject_00d316c8;
  in_RDI[2] = &PTR__QTreeWidget_00d31a08;
  d_func((QTreeWidget *)0x91715c);
  type = (ConnectionType)((ulong)in_RDI >> 0x20);
  this_00 = (array<QMetaObject::Connection,_12UL> *)operator_new(0x58);
  QTreeModel::QTreeModel(in_stack_fffffffffffffdd0,columns,in_stack_fffffffffffffdc0);
  QTreeView::setModel(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  uVar3 = 0;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)(ulong)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe20,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QObjectPrivate::
  connect<void(QTreeView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QObjectPrivate::
  connect<void(QTreeView::*)(QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QAbstractItemView::model((QAbstractItemView *)this_00);
  signal = QAbstractItemModel::dataChanged;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,in_stack_fffffffffffffe30,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QAbstractItemView::model((QAbstractItemView *)this_00);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            ((Object *)in_stack_fffffffffffffe00,(offset_in_QAbstractItemModel_to_subr)signal,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe20,type);
  QAbstractItemView::model((QAbstractItemView *)this_00);
  slot = QAbstractItemModel::columnsRemoved;
  pQVar2 = (QAbstractItemView *)0x0;
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QTreeWidgetPrivate::*)()>
            ((Object *)in_stack_fffffffffffffe00,(offset_in_QAbstractItemModel_to_subr)signal,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),
             (Function)QAbstractItemModel::columnsRemoved,type);
  QAbstractItemView::selectionModel(pQVar2);
  pQVar2 = (QAbstractItemView *)0x0;
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QTreeWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (in_stack_fffffffffffffe00,(offset_in_QItemSelectionModel_to_subr)signal,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),(Function)slot,type);
  QAbstractItemView::selectionModel(pQVar2);
  clickable = 0;
  this_01 = (QHeaderView *)0x0;
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QTreeWidgetPrivate::*)(QItemSelection_const&,QItemSelection_const&)>
            ((Object *)QItemSelectionModel::selectionChanged,
             (offset_in_QItemSelectionModel_to_subr)signal,
             (Object *)CONCAT44(uVar3,in_stack_fffffffffffffdf8),(Function)slot,type);
  std::array<QMetaObject::Connection,_12UL>::operator=
            (this_00,(array<QMetaObject::Connection,_12UL> *)dd);
  std::array<QMetaObject::Connection,_12UL>::~array(this_00);
  QTreeView::header((QTreeView *)this_01);
  QHeaderView::setSectionsClickable(this_01,(bool)clickable);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidget::QTreeWidget(QWidget *parent)
    : QTreeView(*new QTreeWidgetPrivate(), parent)
{
    Q_D(QTreeWidget);
    QTreeView::setModel(new QTreeModel(1, this));
    d->connections = {
        QObjectPrivate::connect(this, &QTreeWidget::pressed,
                                d, &QTreeWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(this, &QTreeWidget::clicked,
                                d, &QTreeWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(this, &QTreeWidget::doubleClicked,
                                d, &QTreeWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(this, &QTreeWidget::activated,
                                d, &QTreeWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(this, &QTreeWidget::entered,
                                d, &QTreeWidgetPrivate::emitItemEntered),
        QObjectPrivate::connect(this, &QTreeWidget::expanded,
                                d, &QTreeWidgetPrivate::emitItemExpanded),
        QObjectPrivate::connect(this, &QTreeWidget::collapsed,
                                d, &QTreeWidgetPrivate::emitItemCollapsed),
        QObjectPrivate::connect(model(), &QAbstractItemModel::dataChanged,
                                d, &QTreeWidgetPrivate::emitItemChanged),
        QObjectPrivate::connect(model(), &QAbstractItemModel::dataChanged,
                                d, &QTreeWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model(), &QAbstractItemModel::columnsRemoved,
                                d, &QTreeWidgetPrivate::sort),
        QObjectPrivate::connect(selectionModel(), &QItemSelectionModel::currentChanged,
                                d, &QTreeWidgetPrivate::emitCurrentItemChanged),
        QObjectPrivate::connect(selectionModel(), &QItemSelectionModel::selectionChanged,
                                d, &QTreeWidgetPrivate::selectionChanged)
    };
    header()->setSectionsClickable(false);
}